

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void free_var_ref(JSRuntime *rt,JSVarRef *var_ref)

{
  list_head *plVar1;
  list_head *plVar2;
  
  if ((var_ref != (JSVarRef *)0x0) &&
     ((var_ref->field_0).header.ref_count = (var_ref->field_0).header.ref_count + -1,
     (var_ref->field_0).header.ref_count == 0)) {
    if (((var_ref->field_0).header.dummy1 & 1) != 0) {
      JS_FreeValueRT(rt,var_ref->value);
    }
    plVar1 = (var_ref->field_0).header.link.prev;
    plVar2 = (var_ref->field_0).header.link.next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (var_ref->field_0).header.link.prev = (list_head *)0x0;
    (var_ref->field_0).header.link.next = (list_head *)0x0;
    (*(rt->mf).js_free)(&rt->malloc_state,var_ref);
    return;
  }
  return;
}

Assistant:

static void free_var_ref(JSRuntime *rt, JSVarRef *var_ref)
{
    if (var_ref) {
        assert(var_ref->header.ref_count > 0);
        if (--var_ref->header.ref_count == 0) {
            if (var_ref->is_detached) {
                JS_FreeValueRT(rt, var_ref->value);
                remove_gc_object(&var_ref->header);
            } else {
                list_del(&var_ref->header.link); /* still on the stack */
            }
            js_free_rt(rt, var_ref);
        }
    }
}